

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FieldMask::ByteSizeLong(FieldMask *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *pTVar4;
  size_t sVar5;
  uint index;
  int n;
  ulong total_size;
  
  uVar1 = (this->paths_).super_RepeatedPtrFieldBase.current_size_;
  total_size = (ulong)uVar1;
  if (0 < (int)uVar1) {
    index = 0;
    do {
      pTVar4 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->paths_).super_RepeatedPtrFieldBase,index);
      uVar3 = (uint)pTVar4->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      total_size = total_size + pTVar4->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    sVar5 = internal::ComputeUnknownFieldsSize
                      (&(this->super_Message).super_MessageLite._internal_metadata_,total_size,
                       &this->_cached_size_);
    return sVar5;
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)total_size;
  return total_size;
}

Assistant:

size_t FieldMask::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldMask)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string paths = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(paths_.size());
  for (int i = 0, n = paths_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      paths_.Get(i));
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}